

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.hpp
# Opt level: O2

unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
 __thiscall
HawkTracer::parser::
make_unique<HawkTracer::parser::EventKlassField,char*,char_const*&,HawkTracer::parser::FieldTypeId,std::shared_ptr<HawkTracer::parser::EventKlass_const>>
          (parser *this,char **args,char **args_1,FieldTypeId *args_2,
          shared_ptr<const_HawkTracer::parser::EventKlass> *args_3)

{
  FieldTypeId type_id;
  EventKlassField *this_00;
  allocator local_8a;
  allocator local_89;
  shared_ptr<const_HawkTracer::parser::EventKlass> local_88;
  string local_70;
  string local_50;
  
  this_00 = (EventKlassField *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_50,*args,&local_89);
  std::__cxx11::string::string((string *)&local_70,*args_1,&local_8a);
  type_id = *args_2;
  local_88.super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (args_3->
           super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_88.super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (args_3->super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>
       )._M_refcount._M_pi;
  (args_3->super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (args_3->super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>).
  _M_ptr = (element_type *)0x0;
  EventKlassField::EventKlassField(this_00,&local_50,&local_70,type_id,&local_88);
  *(EventKlassField **)this = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.
              super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return (__uniq_ptr_data<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>,_true,_true>
          )(__uniq_ptr_data<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> make_unique(Args&&... args)
{
    return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}